

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<Qt::DayOfWeek>::end(QList<Qt::DayOfWeek> *this)

{
  DayOfWeek *n;
  QArrayDataPointer<Qt::DayOfWeek> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<Qt::DayOfWeek> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<Qt::DayOfWeek> *)0x4f0019);
  QArrayDataPointer<Qt::DayOfWeek>::operator->(in_RDI);
  n = QArrayDataPointer<Qt::DayOfWeek>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }